

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

ON_Material *
ON_Material::FromModelComponentRef
          (ON_ModelComponentReference *model_component_reference,ON_Material *none_return_value)

{
  ON_ModelComponent *p;
  ON_Material *pOVar1;
  
  p = ON_ModelComponentReference::ModelComponent(model_component_reference);
  pOVar1 = Cast(&p->super_ON_Object);
  if (pOVar1 == (ON_Material *)0x0) {
    pOVar1 = none_return_value;
  }
  return pOVar1;
}

Assistant:

const ON_Material* ON_Material::FromModelComponentRef(
  const class ON_ModelComponentReference& model_component_reference,
  const ON_Material* none_return_value
  )
{
  const ON_Material* p = ON_Material::Cast(model_component_reference.ModelComponent());
  return (nullptr != p) ? p : none_return_value;
}